

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O0

string * __thiscall bwtil::FileReader::toString_abi_cxx11_(FileReader *this)

{
  ulong uVar1;
  ifstream *piVar2;
  FILE *__stream;
  FileReader *in_RSI;
  string *in_RDI;
  string *s;
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  
  rewind(in_RSI,(FILE *)in_RSI);
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  uVar1 = in_RSI->n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,uVar1,'e',&local_39);
  std::__cxx11::string::operator=(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  piVar2 = in_RSI->fs;
  __stream = (FILE *)std::__cxx11::string::data();
  std::istream::read((char *)piVar2,(long)__stream);
  rewind(in_RSI,__stream);
  return in_RDI;
}

Assistant:

string toString(){

		rewind();
		string s;

		s = string(n,'e');//allocate space for n chars
		fs->read((char *)s.data(),n);

		/*while(not eof())
			s += get();*/

		rewind();

		return s;

	}